

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldOptions_FeatureSupport::~FieldOptions_FeatureSupport
          (FieldOptions_FeatureSupport *this)

{
  ~FieldOptions_FeatureSupport(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

FieldOptions_FeatureSupport::~FieldOptions_FeatureSupport() {
  // @@protoc_insertion_point(destructor:google.protobuf.FieldOptions.FeatureSupport)
  SharedDtor(*this);
}